

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_configchg.c
# Opt level: O0

void ares_event_configchg_cb
               (ares_event_thread_t *e,ares_socket_t fd,void *data,ares_event_flags_t flags)

{
  bool bVar1;
  ares_bool_t aVar2;
  ssize_t sVar3;
  size_t sVar4;
  inotify_event **local_1050;
  uchar *ptr;
  ares_bool_t triggered;
  ssize_t len;
  inotify_event *event;
  uchar buf [4096];
  ares_event_configchg_t *configchg;
  ares_event_flags_t flags_local;
  void *data_local;
  ares_socket_t fd_local;
  ares_event_thread_t *e_local;
  
  bVar1 = false;
  buf._4088_8_ = data;
  while (sVar3 = read(*(int *)buf._4088_8_,&event,0x1000), 0 < sVar3) {
    for (local_1050 = &event; local_1050 < buf + sVar3 + -8;
        local_1050 = (inotify_event **)
                     ((ulong)*(uint *)((long)local_1050 + 0xc) + 0x10 + (long)local_1050)) {
      if (((*(int *)((long)local_1050 + 0xc) != 0) &&
          (sVar4 = ares_strlen((char *)(local_1050 + 2)), sVar4 != 0)) &&
         ((aVar2 = ares_strcaseeq((char *)(local_1050 + 2),"resolv.conf"), aVar2 != ARES_FALSE ||
          (aVar2 = ares_strcaseeq((char *)(local_1050 + 2),"nsswitch.conf"), aVar2 != ARES_FALSE))))
      {
        bVar1 = true;
      }
    }
  }
  if (bVar1) {
    ares_reinit(e->channel);
  }
  return;
}

Assistant:

static void ares_event_configchg_cb(ares_event_thread_t *e, ares_socket_t fd,
                                    void *data, ares_event_flags_t flags)
{
  const ares_event_configchg_t *configchg = data;

  /* Some systems cannot read integer variables if they are not
   * properly aligned. On other systems, incorrect alignment may
   * decrease performance. Hence, the buffer used for reading from
   * the inotify file descriptor should have the same alignment as
   * struct inotify_event. */
  unsigned char                 buf[4096]
    __attribute__((aligned(__alignof__(struct inotify_event))));
  const struct inotify_event *event;
  ssize_t                     len;
  ares_bool_t                 triggered = ARES_FALSE;

  (void)fd;
  (void)flags;

  while (1) {
    const unsigned char *ptr;

    len = read(configchg->inotify_fd, buf, sizeof(buf));
    if (len <= 0) {
      break;
    }

    /* Loop over all events in the buffer. Says kernel will check the buffer
     * size provided, so I assume it won't ever return partial events. */
    for (ptr  = buf; ptr < buf + len;
         ptr += sizeof(struct inotify_event) + event->len) {
      event = (const struct inotify_event *)((const void *)ptr);

      if (event->len == 0 || ares_strlen(event->name) == 0) {
        continue;
      }

      if (ares_strcaseeq(event->name, "resolv.conf") ||
          ares_strcaseeq(event->name, "nsswitch.conf")) {
        triggered = ARES_TRUE;
      }
    }
  }

  /* Only process after all events are read.  No need to process more often as
   * we don't want to reload the config back to back */
  if (triggered) {
    ares_reinit(e->channel);
  }
}